

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

string * google::
         MakeCheckOpString<std::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                   (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *v1,map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *v2,char *exprtext)

{
  ostream *out;
  string *psVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_20;
  
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_20,exprtext);
  ::operator<<((ostream *)local_20.stream_,v1);
  out = base::CheckOpMessageBuilder::ForVar2(&local_20);
  ::operator<<(out,v2);
  psVar1 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_20);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_20);
  return psVar1;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2, const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}